

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O3

string * __thiscall
t_javame_generator::get_cap_name
          (string *__return_storage_ptr__,t_javame_generator *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  
  pcVar2 = (name->_M_dataplus)._M_p;
  iVar5 = toupper((int)*pcVar2);
  *pcVar2 = (char)iVar5;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string t_javame_generator::get_cap_name(std::string name) {
  name[0] = toupper(name[0]);
  return name;
}